

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O3

RC __thiscall RM_FileScan::GetNextRec(RM_FileScan *this,RM_Record *rec)

{
  PF_PageHandle *ph;
  bool bVar1;
  RC RVar2;
  int iVar3;
  char *pData;
  RID rid;
  RM_Record temprec;
  RM_PageHeader *local_68;
  RID local_60;
  RM_Record *local_58;
  RM_Record local_50;
  SlotNum *local_38;
  
  RVar2 = 0x6e;
  if (this->scanEnded == false) {
    if (this->openScan == false) {
      RVar2 = 0x6c;
    }
    else {
      this->hasPagePinned = true;
      local_38 = &this->scanSlot;
      ph = &this->currentPH;
      local_58 = rec;
      while( true ) {
        RM_Record::RM_Record(&local_50);
        RVar2 = RM_FileHandle::GetNextRecord
                          (this->fileHandle,this->scanPage,this->scanSlot,&local_50,ph,
                           this->useNextPage);
        if (RVar2 != 0) break;
        this->hasPagePinned = true;
        if (this->useNextPage == true) {
          RVar2 = RM_FileHandle::GetPageDataAndBitmap
                            (this->fileHandle,ph,(char **)&local_60,&local_68);
          if (RVar2 == 0) {
            iVar3 = local_68->numRecords;
            this->numRecOnPage = iVar3;
          }
          else {
            iVar3 = this->numRecOnPage;
          }
          this->useNextPage = false;
          this->numSeenOnPage = 0;
          if (iVar3 == 1) {
            PF_PageHandle::GetPageNum(ph,&this->scanPage);
          }
        }
        iVar3 = this->numSeenOnPage + 1;
        this->numSeenOnPage = iVar3;
        if (this->numRecOnPage == iVar3) {
          this->useNextPage = true;
          RVar2 = PF_FileHandle::UnpinPage(&this->fileHandle->pfh,this->scanPage);
          if (RVar2 != 0) goto LAB_0011abe7;
          this->hasPagePinned = false;
        }
        RID::RID(&local_60);
        RM_Record::GetRid(&local_50,&local_60);
        RID::GetPageNum(&local_60,&this->scanPage);
        RID::GetSlotNum(&local_60,local_38);
        RVar2 = RM_Record::GetData(&local_50,(char **)&local_68);
        if (RVar2 != 0) {
          RID::~RID(&local_60);
          goto LAB_0011abe7;
        }
        if (this->compOp == NO_OP) {
          RM_Record::operator=(local_58,&local_50);
LAB_0011ac13:
          RID::~RID(&local_60);
          RM_Record::~RM_Record(&local_50);
          return 0;
        }
        bVar1 = (*this->comparator)((void *)((long)&local_68->nextFreePage + (long)this->attrOffset)
                                    ,this->value,this->attrType,this->attrLength);
        if (bVar1) {
          RM_Record::operator=(local_58,&local_50);
          goto LAB_0011ac13;
        }
        RID::~RID(&local_60);
        RM_Record::~RM_Record(&local_50);
      }
      if (RVar2 == 0x6e) {
        this->hasPagePinned = false;
        this->scanEnded = true;
        RVar2 = 0x6e;
      }
LAB_0011abe7:
      RM_Record::~RM_Record(&local_50);
    }
  }
  return RVar2;
}

Assistant:

RC RM_FileScan::GetNextRec(RM_Record &rec) {
  // If the scan has ended, or is not valid, return immediately
  if(scanEnded == true)
    return (RM_EOF);
  if(openScan == false)
    return (RM_INVALIDSCAN);
  hasPagePinned = true;
  
  RC rc;
  while(true){
    // Retrieve next record
    RM_Record temprec;
    if((rc=fileHandle->GetNextRecord(scanPage, scanSlot, temprec, currentPH, useNextPage))){
      if(rc == RM_EOF){
        hasPagePinned = false;
        scanEnded = true;
      }
      return (rc);
    }
    hasPagePinned = true;
    // If we retrieved a record on the next page, reset numRecOnPage to
    // reflect the number of records seen on this new current page
    if(useNextPage){
      GetNumRecOnPage(currentPH, numRecOnPage);
      useNextPage = false;
      numSeenOnPage = 0;
      if(numRecOnPage == 1)
        currentPH.GetPageNum(scanPage);
    }
    numSeenOnPage++; // update # of records seen on this page

    // If we've seen all the record on this page, then next time, we 
    // need to look on the next page, not this page, so unpin the page
    // and set the indicator (useNextPage)
    if(numRecOnPage == numSeenOnPage){
      useNextPage = true;
      //printf("unpin page in filescan\n");
      if(rc = fileHandle->pfh.UnpinPage(scanPage)){
        return (rc);
      }
      hasPagePinned = false;
    }
   
    // Retrieves the RID of the scan to update the progress of the scan
    RID rid;
    temprec.GetRid(rid);
    rid.GetPageNum(scanPage);
    rid.GetSlotNum(scanSlot);

    // Check to see if it satisfies the scan comparison, and if it does,
    // exit the function, returning the record.
    char *pData;
    if((rc = temprec.GetData(pData))){
      return (rc);
    }
    if(compOp != NO_OP){
      bool satisfies = (* comparator)(pData + attrOffset, this->value, attrType, attrLength);
      if(satisfies){
        rec = temprec;
        break;
      }
    }
    else{
      rec = temprec; // if no comparison, just return the record
      break;
    }
  }
  return (0);
}